

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void create_file(char *filename,curl_off_t size)

{
  list<Task_*,_std::allocator<Task_*>_> *plVar1;
  _List_node_base *p_Var2;
  FILE *__stream;
  curl_off_t size_00;
  char *argv;
  string *download_address;
  int argc;
  _List_node_base *p_Var3;
  char **in_stack_fffffffffffffe90;
  int iStack_168;
  string sStack_160;
  string sStack_140;
  download_status dStack_120;
  
  argv = "wb";
  __stream = fopen(filename,"wb");
  argc = (int)filename;
  if (__stream == (FILE *)0x0) {
    create_file();
    curl_global_init(3);
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    dStack_120.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<Task_*,_std::allocator<Task_*>_>::_M_initialize_map
              ((_Deque_base<Task_*,_std::allocator<Task_*>_> *)&dStack_120,0);
    plVar1 = &dStack_120.globalTaskList;
    dStack_120.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&dStack_120.globalProxyList;
    dStack_120.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
    _M_size = 0;
    dStack_120.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
    _M_size = 0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    dStack_120.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    dStack_120.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)plVar1;
    dStack_120.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)plVar1;
    dStack_120.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         dStack_120.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
         super__List_node_base._M_next;
    std::_Deque_base<proxy,_std::allocator<proxy>_>::_M_initialize_map
              ((_Deque_base<proxy,_std::allocator<proxy>_> *)&dStack_120.pending_proxy_servers,0);
    parser((argument *)&stack0xfffffffffffffe90,argc,(char **)argv);
    initialize_proxy_list(in_stack_fffffffffffffe90,iStack_168,&dStack_120);
    download_address = &sStack_160;
    size_00 = get_file_size(download_address,
                            (string *)
                            (dStack_120.globalProxyList.
                             super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
                             super__List_node_base._M_next + 1));
    create_file(sStack_140._M_dataplus._M_p,size_00);
    initialize_task_list(&sStack_140,download_address,size_00,&dStack_120);
    start_progress_thread((curl_off_t)in_stack_fffffffffffffe90,(download_status *)0x102770);
    message_loop(&sStack_140,download_address,size_00,&dStack_120);
    for (p_Var3 = dStack_120.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next; p_Var3 != (_List_node_base *)plVar1
        ; p_Var3 = p_Var3->_M_next) {
      Task::wait((Task *)p_Var3[1]._M_next,download_address);
    }
    curl_global_cleanup();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_140._M_dataplus._M_p != &sStack_140.field_2) {
      operator_delete(sStack_140._M_dataplus._M_p,sStack_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_160._M_dataplus._M_p != &sStack_160.field_2) {
      operator_delete(sStack_160._M_dataplus._M_p,sStack_160.field_2._M_allocated_capacity + 1);
    }
    std::deque<proxy,_std::allocator<proxy>_>::~deque(&dStack_120.pending_proxy_servers.c);
    std::__cxx11::_List_base<proxy,_std::allocator<proxy>_>::_M_clear
              (&dStack_120.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>);
    p_Var3 = dStack_120.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar1) {
      p_Var2 = (((_List_base<Task_*,_std::allocator<Task_*>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var2;
    }
    std::_Deque_base<Task_*,_std::allocator<Task_*>_>::~_Deque_base
              ((_Deque_base<Task_*,_std::allocator<Task_*>_> *)&dStack_120);
    return;
  }
  fseeko(__stream,size + -1,0);
  fputc(0,__stream);
  fclose(__stream);
  return;
}

Assistant:

void create_file(const char *filename, curl_off_t size) {
    FILE *file = fopen(filename, "wb");
    if (file == nullptr) {
        fputs("create file error!", stderr);
        exit(-1);
    }
    fseeko(file, size - 1, SEEK_SET);
    fwrite("\0", 1, 1, file);
    fclose(file);
}